

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  int iVar1;
  int8_t iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  int32_t i;
  long lVar7;
  char *pcVar8;
  MaybeStackArray<char,_30> digits;
  char buffer8 [100];
  
  MaybeStackArray<char,_30>::MaybeStackArray(&digits,this->precision + 1);
  iVar4 = -1;
  lVar7 = 0;
  while( true ) {
    iVar1 = this->precision;
    if (iVar1 <= lVar7) break;
    iVar2 = getDigitPos(this,iVar1 + iVar4);
    digits.ptr[lVar7] = iVar2 + '0';
    lVar7 = lVar7 + 1;
    iVar4 = iVar4 + -1;
  }
  digits.ptr[iVar1] = '\0';
  uVar3 = 999;
  if (this->lOptPos < 999) {
    uVar3 = (ulong)(uint)this->lOptPos;
  }
  uVar5 = 0xfffffc19;
  if (-999 < this->rOptPos) {
    uVar5 = (ulong)(uint)this->rOptPos;
  }
  pcVar8 = "long";
  if (this->usingBytes != false) {
    pcVar8 = "bytes";
  }
  pcVar6 = "-";
  if ((this->flags & 1U) == 0) {
    pcVar6 = "";
  }
  if (this->precision == 0) {
    digits.ptr = "0";
  }
  snprintf(buffer8,100,"<DecimalQuantity %d:%d:%d:%d %s %s%s%s%d>",uVar3,(ulong)(uint)this->lReqPos,
           (ulong)(uint)this->rReqPos,uVar5,pcVar8,pcVar6,digits.ptr,"E",(ulong)(uint)this->scale);
  UnicodeString::UnicodeString(__return_storage_ptr__,buffer8,-1,kInvariant);
  MaybeStackArray<char,_30>::~MaybeStackArray(&digits);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toString() const {
    MaybeStackArray<char, 30> digits(precision + 1);
    for (int32_t i = 0; i < precision; i++) {
        digits[i] = getDigitPos(precision - i - 1) + '0';
    }
    digits[precision] = 0; // terminate buffer
    char buffer8[100];
    snprintf(
            buffer8,
            sizeof(buffer8),
            "<DecimalQuantity %d:%d:%d:%d %s %s%s%s%d>",
            (lOptPos > 999 ? 999 : lOptPos),
            lReqPos,
            rReqPos,
            (rOptPos < -999 ? -999 : rOptPos),
            (usingBytes ? "bytes" : "long"),
            (isNegative() ? "-" : ""),
            (precision == 0 ? "0" : digits.getAlias()),
            "E",
            scale);
    return UnicodeString(buffer8, -1, US_INV);
}